

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  connectbundle *bundle_00;
  connectdata *pcVar6;
  char *local_a0;
  char *local_98;
  connectdata *conn_candidate_1;
  connectdata *conn_candidate;
  connectbundle *bundle;
  size_t pipelen;
  size_t sStack_50;
  _Bool done;
  size_t max_total_connections;
  size_t max_host_connections;
  _Bool waitpipe;
  _Bool force_reuse;
  _Bool connections_available;
  connectdata *pcStack_38;
  _Bool reuse;
  connectdata *conn_temp;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *async_local;
  connectdata **in_connect_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pcStack_38 = (connectdata *)0x0;
  max_host_connections._6_1_ = 1;
  max_host_connections._5_1_ = 0;
  max_host_connections._4_1_ = 0;
  p_Stack_20 = async;
  async_local = (_Bool *)in_connect;
  in_connect_local = (connectdata **)data;
  max_total_connections = Curl_multi_max_host_connections(data->multi);
  sStack_50 = Curl_multi_max_total_connections((Curl_multi *)in_connect_local[0x1b]);
  *p_Stack_20 = false;
  async_local[0] = false;
  async_local[1] = false;
  async_local[2] = false;
  async_local[3] = false;
  async_local[4] = false;
  async_local[5] = false;
  async_local[6] = false;
  async_local[7] = false;
  if (in_connect_local[0x1f7] == (connectdata *)0x0) {
    conn._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    conn_temp = allocate_conn((Curl_easy *)in_connect_local);
    if (conn_temp == (connectdata *)0x0) {
      conn._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *(connectdata **)async_local = conn_temp;
      conn._4_4_ = parseurlandfillconn((Curl_easy *)in_connect_local,conn_temp);
      if (conn._4_4_ == CURLE_OK) {
        if (in_connect_local[0x1ce] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[0x1ce]);
          conn_temp->oauth_bearer = pcVar3;
          if (conn_temp->oauth_bearer == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (in_connect_local[0x1cf] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[0x1cf]);
          conn_temp->unix_domain_socket = pcVar3;
          if (conn_temp->unix_domain_socket == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          conn_temp->abstract_unix_socket = (_Bool)(*(byte *)(in_connect_local + 0x1ec) & 1);
        }
        conn._4_4_ = create_conn_helper_init_proxy(conn_temp);
        if (conn._4_4_ == CURLE_OK) {
          if (((conn_temp->given->flags & 1) != 0) && (((conn_temp->bits).httpproxy & 1U) != 0)) {
            (conn_temp->bits).tunnel_proxy = true;
          }
          conn._4_4_ = parse_remote_port((Curl_easy *)in_connect_local,conn_temp);
          if (((((((conn._4_4_ == CURLE_OK) &&
                  (conn._4_4_ = override_login((Curl_easy *)in_connect_local,conn_temp,
                                               &conn_temp->user,&conn_temp->passwd,
                                               &conn_temp->options), conn._4_4_ == CURLE_OK)) &&
                 (conn._4_4_ = set_login(conn_temp), conn._4_4_ == CURLE_OK)) &&
                ((conn._4_4_ = parse_connect_to_slist
                                         ((Curl_easy *)in_connect_local,conn_temp,
                                          (curl_slist *)in_connect_local[0x14b]),
                 conn._4_4_ == CURLE_OK &&
                 (conn._4_4_ = idnconvert_hostname(conn_temp,&conn_temp->host),
                 conn._4_4_ == CURLE_OK)))) &&
               ((((conn_temp->bits).conn_to_host & 1U) == 0 ||
                (conn._4_4_ = idnconvert_hostname(conn_temp,&conn_temp->conn_to_host),
                conn._4_4_ == CURLE_OK)))) &&
              ((conn._4_4_ = 0, ((conn_temp->bits).httpproxy & 1U) == 0 ||
               (conn._4_4_ = idnconvert_hostname(conn_temp,&(conn_temp->http_proxy).host),
               conn._4_4_ == CURLE_OK)))) &&
             ((conn._4_4_ = 0, ((conn_temp->bits).socksproxy & 1U) == 0 ||
              (conn._4_4_ = idnconvert_hostname(conn_temp,&(conn_temp->socks_proxy).host),
              conn._4_4_ == CURLE_OK)))) {
            conn._4_4_ = 0;
            if ((((conn_temp->bits).conn_to_host & 1U) != 0) &&
               (iVar2 = Curl_strcasecompare((conn_temp->conn_to_host).name,(conn_temp->host).name),
               iVar2 != 0)) {
              (conn_temp->bits).conn_to_host = false;
            }
            if ((((conn_temp->bits).conn_to_port & 1U) != 0) &&
               (conn_temp->conn_to_port == conn_temp->remote_port)) {
              (conn_temp->bits).conn_to_port = false;
            }
            if (((((conn_temp->bits).conn_to_host & 1U) != 0) ||
                (((conn_temp->bits).conn_to_port & 1U) != 0)) &&
               (((conn_temp->bits).httpproxy & 1U) != 0)) {
              (conn_temp->bits).tunnel_proxy = true;
            }
            conn._4_4_ = setup_connection_internals(conn_temp);
            if (conn._4_4_ == CURLE_OK) {
              conn_temp->recv[0] = Curl_recv_plain;
              conn_temp->send[0] = Curl_send_plain;
              conn_temp->recv[1] = Curl_recv_plain;
              conn_temp->send[1] = Curl_send_plain;
              (conn_temp->bits).tcp_fastopen = (_Bool)(*(byte *)(in_connect_local + 0x1e3) & 1);
              if ((conn_temp->handler->flags & 0x10) == 0) {
                in_connect_local[0x154] = in_connect_local[0x1af];
                in_connect_local[0x16a] = in_connect_local[0x1b0];
                in_connect_local[0x155] = in_connect_local[0x1b1];
                in_connect_local[0x16b] = in_connect_local[0x1b2];
                in_connect_local[0x157] = in_connect_local[0x1ba];
                in_connect_local[0x16d] = in_connect_local[0x1ba];
                in_connect_local[0x158] = in_connect_local[0x1b9];
                in_connect_local[0x16e] = in_connect_local[0x1b9];
                in_connect_local[0x159] = in_connect_local[0x1b5];
                in_connect_local[0x16f] = in_connect_local[0x1b6];
                in_connect_local[0x15a] = in_connect_local[0x1b7];
                in_connect_local[0x170] = in_connect_local[0x1b8];
                in_connect_local[0x15d] = in_connect_local[0x1bc];
                in_connect_local[0x173] = in_connect_local[0x1bd];
                in_connect_local[0x15e] = in_connect_local[0x1be];
                in_connect_local[0x174] = in_connect_local[0x1bf];
                in_connect_local[0x162] = in_connect_local[0x195];
                in_connect_local[0x178] = in_connect_local[0x196];
                in_connect_local[0x163] = in_connect_local[0x197];
                in_connect_local[0x179] = in_connect_local[0x198];
                in_connect_local[0x164] = in_connect_local[0x1a2];
                in_connect_local[0x17a] = in_connect_local[0x1a3];
                in_connect_local[0x165] = in_connect_local[0x1a6];
                in_connect_local[0x17b] = in_connect_local[0x1a7];
                in_connect_local[0x166] = in_connect_local[0x1a4];
                in_connect_local[0x17c] = in_connect_local[0x1a5];
                in_connect_local[0x156] = in_connect_local[0x195];
                in_connect_local[0x16c] = in_connect_local[0x196];
                _Var1 = Curl_clone_primary_ssl_config
                                  ((ssl_primary_config *)(in_connect_local + 0x151),
                                   &conn_temp->ssl_config);
                if (_Var1) {
                  _Var1 = Curl_clone_primary_ssl_config
                                    ((ssl_primary_config *)(in_connect_local + 0x167),
                                     &conn_temp->proxy_ssl_config);
                  if (_Var1) {
                    prune_dead_connections((Curl_easy *)in_connect_local);
                    if (((*(byte *)((long)in_connect_local + 0xc63) & 1) == 0) ||
                       (((ulong)in_connect_local[0x23c] & 1) != 0)) {
                      max_host_connections._7_1_ =
                           ConnectionExists((Curl_easy *)in_connect_local,conn_temp,
                                            &stack0xffffffffffffffc8,
                                            (_Bool *)((long)&max_host_connections + 5),
                                            (_Bool *)((long)&max_host_connections + 4));
                    }
                    else {
                      max_host_connections._7_1_ = false;
                    }
                    if ((((_Bool)max_host_connections._7_1_ != false) &&
                        ((max_host_connections._5_1_ & 1) == 0)) &&
                       ((iVar2 = IsPipeliningPossible((Curl_easy *)in_connect_local,pcStack_38),
                        iVar2 != 0 &&
                        (lVar4 = (pcStack_38->send_pipe).size + (pcStack_38->recv_pipe).size,
                        lVar4 != 0)))) {
                      Curl_infof((Curl_easy *)in_connect_local,
                                 "Found connection %ld, with requests in the pipe (%zu)\n",
                                 pcStack_38->connection_id,lVar4);
                      sVar5 = Curl_conncache_bundle_size(pcStack_38);
                      if ((sVar5 < max_total_connections) &&
                         (sVar5 = Curl_conncache_size((Curl_easy *)in_connect_local),
                         sVar5 < sStack_50)) {
                        max_host_connections._7_1_ = 0;
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "We can reuse, but we want a new connection anyway\n");
                        Curl_conncache_return_conn(pcStack_38);
                      }
                    }
                    if ((max_host_connections._7_1_ & 1) == 0) {
                      if ((conn_temp->handler->flags & 0x100) != 0) {
                        if ((*(byte *)((long)in_connect_local + 0xf29) & 1) != 0) {
                          (conn_temp->bits).tls_enable_alpn = true;
                        }
                        if (((ulong)in_connect_local[0x1e5] & 1) != 0) {
                          (conn_temp->bits).tls_enable_npn = true;
                        }
                      }
                      if ((max_host_connections._4_1_ & 1) == 0) {
                        bundle_00 = Curl_conncache_find_bundle
                                              (conn_temp,(conncache *)in_connect_local[0x232]);
                        if (((max_total_connections == 0) || (bundle_00 == (connectbundle *)0x0)) ||
                           (bundle_00->num_connections < max_total_connections)) {
                          Curl_conncache_unlock((Curl_easy *)in_connect_local);
                        }
                        else {
                          pcVar6 = Curl_conncache_extract_bundle
                                             ((Curl_easy *)in_connect_local,bundle_00);
                          Curl_conncache_unlock((Curl_easy *)in_connect_local);
                          if (pcVar6 == (connectdata *)0x0) {
                            Curl_infof((Curl_easy *)in_connect_local,
                                       "No more connections allowed to host: %zu\n",
                                       max_total_connections);
                            max_host_connections._6_1_ = 0;
                          }
                          else {
                            Curl_disconnect((Curl_easy *)in_connect_local,pcVar6,false);
                          }
                        }
                      }
                      else {
                        max_host_connections._6_1_ = 0;
                      }
                      if ((((max_host_connections._6_1_ & 1) != 0) && (sStack_50 != 0)) &&
                         (sVar5 = Curl_conncache_size((Curl_easy *)in_connect_local),
                         sStack_50 <= sVar5)) {
                        pcVar6 = Curl_conncache_extract_oldest((Curl_easy *)in_connect_local);
                        if (pcVar6 == (connectdata *)0x0) {
                          Curl_infof((Curl_easy *)in_connect_local,
                                     "No connections available in cache\n");
                          max_host_connections._6_1_ = 0;
                        }
                        else {
                          Curl_disconnect((Curl_easy *)in_connect_local,pcVar6,false);
                        }
                      }
                      if ((max_host_connections._6_1_ & 1) == 0) {
                        Curl_infof((Curl_easy *)in_connect_local,"No connections available.\n");
                        conn_free(conn_temp);
                        async_local[0] = false;
                        async_local[1] = false;
                        async_local[2] = false;
                        async_local[3] = false;
                        async_local[4] = false;
                        async_local[5] = false;
                        async_local[6] = false;
                        async_local[7] = false;
                        return CURLE_NO_CONNECTION_AVAILABLE;
                      }
                      conn._4_4_ = Curl_conncache_add_conn
                                             ((conncache *)in_connect_local[0x232],conn_temp);
                      if (conn._4_4_ != CURLE_OK) {
                        return conn._4_4_;
                      }
                      if ((((ulong)in_connect_local[0x260] & 0x28) != 0) &&
                         (((ulong)in_connect_local[0x262] & 1) != 0)) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "NTLM picked AND auth done set, clear picked!\n");
                        in_connect_local[0x260] = (connectdata *)0x0;
                        *(undefined1 *)(in_connect_local + 0x262) = 0;
                      }
                      if ((((ulong)in_connect_local[0x264] & 0x28) != 0) &&
                         (((ulong)in_connect_local[0x266] & 1) != 0)) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "NTLM-proxy picked AND auth done set, clear picked!\n");
                        in_connect_local[0x264] = (connectdata *)0x0;
                        *(undefined1 *)(in_connect_local + 0x266) = 0;
                      }
                    }
                    else {
                      reuse_conn(conn_temp,pcStack_38);
                      (*Curl_cfree)(conn_temp->ssl_extra);
                      (*Curl_cfree)(conn_temp);
                      conn_temp = pcStack_38;
                      *(connectdata **)async_local = pcStack_38;
                      pcVar3 = "host";
                      if (((pcStack_38->bits).proxy & 1U) != 0) {
                        pcVar3 = "proxy";
                      }
                      if ((pcStack_38->socks_proxy).host.name == (char *)0x0) {
                        if ((pcStack_38->http_proxy).host.name == (char *)0x0) {
                          local_a0 = (pcStack_38->host).dispname;
                        }
                        else {
                          local_a0 = (pcStack_38->http_proxy).host.dispname;
                        }
                        local_98 = local_a0;
                      }
                      else {
                        local_98 = (pcStack_38->socks_proxy).host.dispname;
                      }
                      Curl_infof((Curl_easy *)in_connect_local,
                                 "Re-using existing connection! (#%ld) with %s %s\n",
                                 pcStack_38->connection_id,pcVar3,local_98);
                    }
                    Curl_init_do((Curl_easy *)in_connect_local,conn_temp);
                    conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                    if (conn._4_4_ == CURLE_OK) {
                      conn_temp->seek_func = (curl_seek_callback)in_connect_local[0xe2];
                      conn_temp->seek_client = in_connect_local[0xf4];
                      conn._4_4_ = resolve_server((Curl_easy *)in_connect_local,conn_temp,p_Stack_20
                                                 );
                      strip_trailing_dot(&conn_temp->host);
                      if (((conn_temp->bits).httpproxy & 1U) != 0) {
                        strip_trailing_dot(&(conn_temp->http_proxy).host);
                      }
                      if (((conn_temp->bits).socksproxy & 1U) != 0) {
                        strip_trailing_dot(&(conn_temp->socks_proxy).host);
                      }
                      if (((conn_temp->bits).conn_to_host & 1U) != 0) {
                        strip_trailing_dot(&conn_temp->conn_to_host);
                      }
                    }
                  }
                  else {
                    conn._4_4_ = CURLE_OUT_OF_MEMORY;
                  }
                }
                else {
                  conn._4_4_ = CURLE_OUT_OF_MEMORY;
                }
              }
              else {
                Curl_persistconninfo(conn_temp);
                conn._4_4_ = (*conn_temp->handler->connect_it)
                                       (conn_temp,(_Bool *)((long)&pipelen + 7));
                if (conn._4_4_ == CURLE_OK) {
                  (conn_temp->bits).tcpconnect[0] = true;
                  conn._4_4_ = Curl_conncache_add_conn
                                         ((conncache *)in_connect_local[0x232],conn_temp);
                  if (conn._4_4_ != CURLE_OK) {
                    return conn._4_4_;
                  }
                  conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                  if (conn._4_4_ != CURLE_OK) {
                    (*conn_temp->handler->done)(conn_temp,conn._4_4_,false);
                    return conn._4_4_;
                  }
                  Curl_setup_transfer(conn_temp,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
                }
                Curl_init_do((Curl_easy *)in_connect_local,conn_temp);
              }
            }
          }
        }
      }
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;
  *in_connect = NULL;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &conn->user, &conn->passwd,
                          &conn->options);
  if(result)
    goto out;

  result = set_login(conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-convert the hostnames
   *************************************************************/
  result = idnconvert_hostname(conn, &conn->host);
  if(result)
    goto out;
  if(conn->bits.conn_to_host) {
    result = idnconvert_hostname(conn, &conn->conn_to_host);
    if(result)
      goto out;
  }
  if(conn->bits.httpproxy) {
    result = idnconvert_hostname(conn, &conn->http_proxy.host);
    if(result)
      goto out;
  }
  if(conn->bits.socksproxy) {
    result = idnconvert_hostname(conn, &conn->socks_proxy.host);
    if(result)
      goto out;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-converted.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    Curl_persistconninfo(conn);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }

      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                          -1, NULL); /* no upload */
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). */
  if(data->set.reuse_fresh && !data->state.this_is_a_follow)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection that is now marked as in use, we may
     still want to open a new connection if we are pipelining. */
  if(reuse && !force_reuse && IsPipeliningPossible(data, conn_temp)) {
    size_t pipelen = conn_temp->send_pipe.size + conn_temp->recv_pipe.size;
    if(pipelen > 0) {
      infof(data, "Found connection %ld, with requests in the pipe (%zu)\n",
            conn_temp->connection_id, pipelen);

      if(Curl_conncache_bundle_size(conn_temp) < max_host_connections &&
         Curl_conncache_size(data) < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
        Curl_conncache_return_conn(conn_temp);
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    reuse_conn(conn, conn_temp);
#ifdef USE_SSL
    free(conn->ssl_extra);
#endif
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for pipelining
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        Curl_conncache_unlock(data);

        if(conn_candidate)
          (void)Curl_disconnect(data, conn_candidate,
                                /* dead_connection */ FALSE);
        else {
          infof(data, "No more connections allowed to host: %zu\n",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        Curl_conncache_unlock(data);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);
      if(conn_candidate)
        (void)Curl_disconnect(data, conn_candidate,
                              /* dead_connection */ FALSE);
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

  /* Strip trailing dots. resolve_server copied the name. */
  strip_trailing_dot(&conn->host);
  if(conn->bits.httpproxy)
    strip_trailing_dot(&conn->http_proxy.host);
  if(conn->bits.socksproxy)
    strip_trailing_dot(&conn->socks_proxy.host);
  if(conn->bits.conn_to_host)
    strip_trailing_dot(&conn->conn_to_host);

out:
  return result;
}